

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

void __thiscall CWire::~CWire(CWire *this)

{
  ~CWire(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

CWire::~CWire()
{
	///thyeros- make sure that this doesn't belong to any NET [6/16/2006]
	assert(m_pParent==NULL);

	ClearSegmentList();
#ifdef _DEBUG
	m_iNumInstance--;
	m_InstanceList.erase(this);
	assert(m_iNumInstance==m_InstanceList.size());
#endif
}